

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.hpp
# Opt level: O0

void __thiscall
pstore::serialize::archive::
range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::get<int>(range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *this,int *v)

{
  reference puVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  int *local_28;
  uint8_t *last;
  uint8_t *ptr;
  int *v_local;
  range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_local;
  
  local_28 = v + 1;
  last = (uint8_t *)v;
  ptr = (uint8_t *)v;
  v_local = (int *)this;
  while ((int *)last != local_28) {
    local_30 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator++(&this->first_,0);
    puVar1 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_30);
    *last = *puVar1;
    last = last + 1;
  }
  return;
}

Assistant:

void get (Ty & v) {
                    static_assert (std::is_standard_layout<Ty>::value,
                                   "range_reader can only read standard-layout types");
                    auto ptr = reinterpret_cast<std::uint8_t *> (&v);
                    auto const last = ptr + sizeof (Ty);
                    while (ptr != last) {
                        *(ptr++) = *(first_++);
                    }
                }